

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O3

error<idx2::err_code> idx2::ReadFile(cstr FileName,buffer *Buf)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined4 uVar8;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar9;
  
  __stream = fopen(FileName,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x13;
    lVar3 = -0x1f8;
    do {
      if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3) == 0xd) {
        iVar2 = 0xd;
        goto LAB_0019b996;
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0);
    iVar2 = 0x15;
LAB_0019b996:
    lVar3 = 0;
    do {
      if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar3) == iVar2) {
        puVar5 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
        uVar6 = 0x1000000000d;
        uVar8 = 0x13;
        goto LAB_0019b9e7;
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x1f8);
  }
  else {
    iVar2 = fseeko(__stream,0,2);
    if (iVar2 == 0) {
      sVar4 = ftello(__stream);
      if (sVar4 == 0xffffffffffffffff) {
        *(char **)(*in_FS_OFFSET + -0x400) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x1a;
        lVar3 = -0x1f8;
        do {
          if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3) == 0x10) {
            iVar2 = 0x10;
            goto LAB_0019bba8;
          }
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0);
        iVar2 = 0x15;
LAB_0019bba8:
        lVar3 = 0;
        do {
          if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar3) == iVar2) {
            puVar5 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
            uVar6 = 0x10000000010;
            uVar8 = 0x1a;
            goto LAB_0019b9e7;
          }
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0x1f8);
      }
      else {
        iVar2 = fseeko(__stream,0,0);
        if (iVar2 == 0) {
          if (Buf->Bytes < (long)sVar4) {
            if (Mallocator()::Instance == '\0') {
              ReadFile();
            }
            AllocBuf(Buf,sVar4,(allocator *)&Mallocator()::Instance);
          }
          sVar4 = fread(Buf->Data,sVar4,1,__stream);
          lVar3 = *in_FS_OFFSET;
          *(char **)(*in_FS_OFFSET + -0x400) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
          ;
          if (sVar4 == 1) {
            *(undefined4 *)(lVar3 + -0x200) = 0x26;
            pcVar7 = "";
            uVar6 = 0;
LAB_0019ba57:
            fclose(__stream);
LAB_0019ba5f:
            eVar9.Code = (int)uVar6;
            eVar9.StackIdx = (char)((ulong)uVar6 >> 0x20);
            eVar9.StrGened = (bool)(char)((ulong)uVar6 >> 0x28);
            eVar9._14_2_ = (short)((ulong)uVar6 >> 0x30);
            eVar9.Msg = pcVar7;
            return eVar9;
          }
          *(undefined4 *)(lVar3 + -0x200) = 0x23;
          lVar3 = -0x1f8;
          do {
            if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3) == 0xb) {
              iVar2 = 0xb;
              goto LAB_0019bc14;
            }
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0);
          iVar2 = 0x15;
LAB_0019bc14:
          lVar3 = 0;
          do {
            if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar3) == iVar2) {
              lVar1 = *in_FS_OFFSET;
              iVar2 = snprintf((char *)(lVar1 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                               (ulong)*(uint *)((long)&err_code_s::NameMap.Arr[0].Name.Size + lVar3)
                               ,*(undefined8 *)
                                 ((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar3),
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                               ,0x23);
              snprintf((char *)(lVar1 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
              DeallocBuf(Buf);
              uVar6 = 0x1000000000b;
              goto LAB_0019ba52;
            }
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0x1f8);
        }
        else {
          *(char **)(*in_FS_OFFSET + -0x400) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x1c;
          lVar3 = -0x1f8;
          do {
            if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3) == 0xf) {
              iVar2 = 0xf;
              goto LAB_0019bb67;
            }
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0);
          iVar2 = 0x15;
LAB_0019bb67:
          lVar3 = 0;
          do {
            if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar3) == iVar2) {
              puVar5 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
              uVar6 = 0x1000000000f;
              uVar8 = 0x1c;
              goto LAB_0019b9e7;
            }
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0x1f8);
        }
      }
    }
    else {
      *(char **)(*in_FS_OFFSET + -0x400) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x17;
      lVar3 = -0x1f8;
      do {
        if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3) == 0xf) {
          iVar2 = 0xf;
          goto LAB_0019b95b;
        }
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0);
      iVar2 = 0x15;
LAB_0019b95b:
      lVar3 = 0;
      do {
        if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar3) == iVar2) {
          puVar5 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
          uVar6 = 0x1000000000f;
          uVar8 = 0x17;
LAB_0019b9e7:
          lVar3 = *in_FS_OFFSET;
          iVar2 = snprintf((char *)(lVar3 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                           (ulong)*(uint *)(puVar5 + 1),*puVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                           ,uVar8);
          snprintf((char *)(lVar3 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
LAB_0019ba52:
          pcVar7 = "%s";
          if (__stream == (FILE *)0x0) goto LAB_0019ba5f;
          goto LAB_0019ba57;
        }
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0x1f8);
    }
  }
  __assert_fail("It != End(EnumS.NameMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                ,0xc,"stref idx2::ToString(err_code)");
}

Assistant:

error<>
ReadFile(cstr FileName, buffer* Buf)
{
  idx2_Assert((Buf->Data && Buf->Bytes) || (!Buf->Data && !Buf->Bytes));

  FILE* Fp = fopen(FileName, "rb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileOpenFailed, "%s", FileName);

  /* Determine the file size */
  if (idx2_FSeek(Fp, 0, SEEK_END))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  i64 Size = 0;
  if ((Size = idx2_FTell(Fp)) == -1)
    return idx2_Error(err_code::FileTellFailed, "%s", FileName);
  if (idx2_FSeek(Fp, 0, SEEK_SET))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  if (Buf->Bytes < Size)
    AllocBuf(Buf, Size);

  /* Read file contents */
  idx2_CleanUp(1, DeallocBuf(Buf));
  if (fread(Buf->Data, size_t(Size), 1, Fp) != 1)
    return idx2_Error(err_code::FileReadFailed, "%s", FileName);

  idx2_DismissCleanUp(1);
  return idx2_Error(err_code::NoError);
}